

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O1

deUint32 __thiscall
sglr::rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::allocateName
          (ObjectManager<sglr::rc::ShaderProgramObjectContainer> *this)

{
  deUint32 dVar1;
  TestError *this_00;
  
  if (this->m_lastName != 0xffffffff) {
    dVar1 = this->m_lastName + 1;
    this->m_lastName = dVar1;
    return dVar1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_lastName != 0xffffffff",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.hpp"
             ,0x1ee);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

deUint32 ObjectManager<T>::allocateName (void)
{
	TCU_CHECK(m_lastName != 0xffffffff);
	return ++m_lastName;
}